

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Headers.cpp
# Opt level: O2

void __thiscall KDReports::Test::testNoHeaders(Test *this)

{
  char cVar1;
  void *pvVar2;
  int iVar3;
  bool bVar4;
  Report report;
  long local_10;
  
  KDReports::Report::Report(&report,(QObject *)0x0);
  if (*(long *)(local_10 + 0x78) == 0) {
    bVar4 = true;
  }
  else {
    bVar4 = *(long *)(*(long *)(local_10 + 0x78) + 0x30) == 0;
  }
  cVar1 = QTest::qVerify(bVar4,"headers.isEmpty()","",
                         "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/Headers/Headers.cpp"
                         ,0x1f);
  if (cVar1 != '\0') {
    iVar3 = (int)local_10 + 0x78;
    pvVar2 = (void *)KDReports::HeaderMap::headerForPage(iVar3,1);
    bVar4 = QTest::compare_ptr_helper
                      (pvVar2,(void *)0x0,"headers.headerForPage(1, 2)","( Header * )nullptr",
                       "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/Headers/Headers.cpp"
                       ,0x20);
    if (bVar4) {
      pvVar2 = (void *)KDReports::HeaderMap::headerForPage(iVar3,2);
      QTest::compare_ptr_helper
                (pvVar2,(void *)0x0,"headers.headerForPage(2, 2)","( Header * )nullptr",
                 "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/Headers/Headers.cpp"
                 ,0x21);
    }
  }
  KDReports::Report::~Report(&report);
  return;
}

Assistant:

void testNoHeaders()
    {
        Report report;
        HeaderMap &headers = report.d->m_headers;
        QVERIFY(headers.isEmpty());
        QCOMPARE(headers.headerForPage(1, 2), ( Header * )nullptr);
        QCOMPARE(headers.headerForPage(2, 2), ( Header * )nullptr);
    }